

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool parse_parent_address(char *address)

{
  sockaddr_in addr;
  int iVar1;
  mapped_type *pmVar2;
  Ip_Port IVar3;
  mapped_type *pmVar4;
  key_type local_18;
  char *local_10;
  char *address_local;
  
  local_10 = address;
  pmVar2 = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,&global_map_id);
  parse_address(address,pmVar2);
  iVar1 = global_map_id;
  pmVar2 = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,&global_map_id);
  addr.sin_family = pmVar2->sin_family;
  addr.sin_port = pmVar2->sin_port;
  addr.sin_addr.s_addr = (pmVar2->sin_addr).s_addr;
  addr.sin_zero[0] = pmVar2->sin_zero[0];
  addr.sin_zero[1] = pmVar2->sin_zero[1];
  addr.sin_zero[2] = pmVar2->sin_zero[2];
  addr.sin_zero[3] = pmVar2->sin_zero[3];
  addr.sin_zero[4] = pmVar2->sin_zero[4];
  addr.sin_zero[5] = pmVar2->sin_zero[5];
  addr.sin_zero[6] = pmVar2->sin_zero[6];
  addr.sin_zero[7] = pmVar2->sin_zero[7];
  IVar3 = get_ip_port(addr);
  local_18.first = IVar3.first;
  local_18.second = IVar3.second;
  pmVar4 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&local_18);
  *pmVar4 = iVar1;
  id_parent = global_map_id;
  global_map_id = global_map_id + 1;
  return true;
}

Assistant:

bool parse_parent_address(char* address) {
    parse_address(address, connections[global_map_id]);
    idconnections[get_ip_port(connections[global_map_id])] = global_map_id;
    id_parent = global_map_id;
    ++global_map_id;

    return true;
}